

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_grid.c
# Opt level: O0

REF_STATUS ref_grid_pack(REF_GRID ref_grid)

{
  uint uVar1;
  REF_STATUS ref_private_macro_code_rss_7;
  REF_STATUS ref_private_macro_code_rss_6;
  REF_STATUS ref_private_macro_code_rss_5;
  REF_STATUS ref_private_macro_code_rss_4;
  REF_STATUS ref_private_macro_code_rss_3;
  REF_STATUS ref_private_macro_code_rss_2;
  REF_STATUS ref_private_macro_code_rss_1;
  REF_STATUS ref_private_macro_code_rss;
  REF_BOOL timing;
  REF_EDGE ref_edge;
  REF_CELL ref_cell;
  REF_INT *n2o;
  REF_INT *o2n;
  REF_GRID pRStack_18;
  REF_INT group;
  REF_GRID ref_grid_local;
  
  pRStack_18 = ref_grid;
  uVar1 = ref_node_synchronize_globals(ref_grid->node);
  if (uVar1 == 0) {
    uVar1 = ref_edge_create((REF_EDGE *)&ref_private_macro_code_rss,pRStack_18);
    if (uVar1 == 0) {
      uVar1 = ref_edge_rcm(_ref_private_macro_code_rss,&n2o,(REF_INT **)&ref_cell);
      if (uVar1 == 0) {
        uVar1 = ref_edge_free(_ref_private_macro_code_rss);
        if (uVar1 == 0) {
          uVar1 = ref_node_pack(pRStack_18->node,n2o,(REF_INT *)ref_cell);
          if (uVar1 == 0) {
            o2n._4_4_ = 0;
            ref_edge = (REF_EDGE)pRStack_18->cell[0];
            while (o2n._4_4_ < 0x10) {
              uVar1 = ref_cell_pack((REF_CELL)ref_edge,n2o);
              if (uVar1 != 0) {
                printf("%s: %d: %s: %d %s\n",
                       "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_grid.c"
                       ,0xb0,"ref_grid_pack",(ulong)uVar1,"pack cell");
                return uVar1;
              }
              o2n._4_4_ = o2n._4_4_ + 1;
              ref_edge = (REF_EDGE)pRStack_18->cell[o2n._4_4_];
            }
            uVar1 = ref_geom_pack(pRStack_18->geom,n2o);
            if (uVar1 == 0) {
              uVar1 = ref_interp_pack(pRStack_18->interp,(REF_INT *)ref_cell);
              if (uVar1 == 0) {
                if (ref_cell != (REF_CELL)0x0) {
                  free(ref_cell);
                }
                if (n2o != (REF_INT *)0x0) {
                  free(n2o);
                }
                ref_grid_local._4_4_ = 0;
              }
              else {
                printf("%s: %d: %s: %d %s\n",
                       "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_grid.c"
                       ,0xb6,"ref_grid_pack",(ulong)uVar1,"pack interp");
                ref_grid_local._4_4_ = uVar1;
              }
            }
            else {
              printf("%s: %d: %s: %d %s\n",
                     "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_grid.c"
                     ,0xb4,"ref_grid_pack",(ulong)uVar1,"pack geom");
              ref_grid_local._4_4_ = uVar1;
            }
          }
          else {
            printf("%s: %d: %s: %d %s\n",
                   "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_grid.c",
                   0xad,"ref_grid_pack",(ulong)uVar1,"pack node");
            ref_grid_local._4_4_ = uVar1;
          }
        }
        else {
          printf("%s: %d: %s: %d %s\n",
                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_grid.c",
                 0xaa,"ref_grid_pack",(ulong)uVar1,"free edge");
          ref_grid_local._4_4_ = uVar1;
        }
      }
      else {
        printf("%s: %d: %s: %d %s\n",
               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_grid.c",0xa9
               ,"ref_grid_pack",(ulong)uVar1,"compact");
        ref_grid_local._4_4_ = uVar1;
      }
    }
    else {
      printf("%s: %d: %s: %d %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_grid.c",0xa8,
             "ref_grid_pack",(ulong)uVar1,"create edge");
      ref_grid_local._4_4_ = uVar1;
    }
  }
  else {
    printf("%s: %d: %s: %d %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_grid.c",0xa6,
           "ref_grid_pack",(ulong)uVar1,"sync globals");
    ref_grid_local._4_4_ = uVar1;
  }
  return ref_grid_local._4_4_;
}

Assistant:

REF_FCN REF_STATUS ref_grid_pack(REF_GRID ref_grid) {
  REF_INT group;
  REF_INT *o2n, *n2o;
  REF_CELL ref_cell;
  REF_EDGE ref_edge;
  REF_BOOL timing = REF_FALSE;

  RSS(ref_node_synchronize_globals(ref_grid_node(ref_grid)), "sync globals");

  RSS(ref_edge_create(&ref_edge, ref_grid), "create edge");
  RSS(ref_edge_rcm(ref_edge, &o2n, &n2o), "compact");
  RSS(ref_edge_free(ref_edge), "free edge");
  if (timing) ref_mpi_stopwatch_stop(ref_grid_mpi(ref_grid), " pack rcm");

  RSS(ref_node_pack(ref_grid_node(ref_grid), o2n, n2o), "pack node");
  if (timing) ref_mpi_stopwatch_stop(ref_grid_mpi(ref_grid), " pack node");
  each_ref_grid_all_ref_cell(ref_grid, group, ref_cell) {
    RSS(ref_cell_pack(ref_cell, o2n), "pack cell");
  }
  if (timing) ref_mpi_stopwatch_stop(ref_grid_mpi(ref_grid), " pack cell");

  RSS(ref_geom_pack(ref_grid_geom(ref_grid), o2n), "pack geom");
  if (timing) ref_mpi_stopwatch_stop(ref_grid_mpi(ref_grid), " pack geom");
  RSS(ref_interp_pack(ref_grid_interp(ref_grid), n2o), "pack interp");
  if (timing) ref_mpi_stopwatch_stop(ref_grid_mpi(ref_grid), " pack interp");

  ref_free(n2o);
  ref_free(o2n);

  return REF_SUCCESS;
}